

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::HandleSequence(SingleDocParser *this,EventHandler *eventHandler)

{
  Token *pTVar1;
  
  pTVar1 = Scanner::peek(this->m_scanner);
  if (pTVar1->type == FLOW_SEQ_START) {
    HandleFlowSequence(this,eventHandler);
    return;
  }
  if (pTVar1->type == BLOCK_SEQ_START) {
    HandleBlockSequence(this,eventHandler);
    return;
  }
  return;
}

Assistant:

void SingleDocParser::HandleSequence(EventHandler& eventHandler) {
  // split based on start token
  switch (m_scanner.peek().type) {
    case Token::BLOCK_SEQ_START:
      HandleBlockSequence(eventHandler);
      break;
    case Token::FLOW_SEQ_START:
      HandleFlowSequence(eventHandler);
      break;
    default:
      break;
  }
}